

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void sarimax_summary(sarimax_object obj)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  
  iVar7 = obj->q;
  iVar10 = obj->p;
  iVar2 = obj->P;
  iVar3 = obj->M;
  iVar4 = obj->r;
  iVar5 = obj->Q;
  if ((uint)obj->method < 2) {
    puts("\n\nExit Status ");
    printf("Return Code : %d \n",(ulong)(uint)obj->retval);
    printf("Exit Message : ");
    uVar6 = obj->retval;
    if (((ulong)uVar6 < 0x10) && ((0x9493U >> (uVar6 & 0x1f) & 1) != 0)) {
      printf((&PTR_anon_var_dwarf_a20_0015dd10)[uVar6]);
    }
  }
  iVar7 = iVar7 + iVar10 + iVar2 + iVar5 + iVar3;
  puts("\n");
  iVar10 = 0;
  printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",(ulong)(uint)obj->p,
         (ulong)(uint)obj->d,(ulong)(uint)obj->q,(ulong)(uint)obj->P,(ulong)(uint)obj->D,obj->Q);
  putchar(10);
  printf("%-20s%-20s%-20s \n\n","Coefficients","Value","Standard Error");
  if (0 < obj->p) {
    lVar11 = 0;
    do {
      dVar12 = obj->phi[lVar11];
      if (obj->vcov[iVar10] < 0.0) {
        sqrt(obj->vcov[iVar10]);
      }
      lVar1 = lVar11 + 1;
      printf("AR%-15d%-20g%-20g \n",dVar12,(ulong)((int)lVar11 + 1));
      iVar10 = iVar10 + iVar7 + 1;
      lVar11 = lVar1;
    } while (lVar1 < obj->p);
  }
  if (0 < obj->q) {
    lVar11 = 0;
    do {
      iVar10 = (int)lVar11;
      dVar12 = obj->theta[lVar11];
      if (obj->vcov[(obj->p + iVar10) * (iVar7 + 1)] < 0.0) {
        sqrt(obj->vcov[(obj->p + iVar10) * (iVar7 + 1)]);
      }
      lVar11 = lVar11 + 1;
      printf("MA%-15d%-20g%-20g \n",dVar12,(ulong)(iVar10 + 1));
    } while (lVar11 < obj->q);
  }
  if (0 < obj->P) {
    lVar11 = 0;
    do {
      iVar10 = (int)lVar11;
      dVar12 = obj->PHI[lVar11];
      if (obj->vcov[(obj->p + obj->q + iVar10) * (iVar7 + 1)] < 0.0) {
        sqrt(obj->vcov[(obj->p + obj->q + iVar10) * (iVar7 + 1)]);
      }
      lVar11 = lVar11 + 1;
      printf("SAR%-14d%-20g%-20g \n",dVar12,(ulong)(iVar10 + 1));
    } while (lVar11 < obj->P);
  }
  if (0 < obj->Q) {
    lVar11 = 0;
    do {
      iVar10 = (int)lVar11;
      dVar12 = obj->THETA[lVar11];
      if (obj->vcov[(obj->p + obj->q + obj->P + iVar10) * (iVar7 + 1)] < 0.0) {
        sqrt(obj->vcov[(obj->p + obj->q + obj->P + iVar10) * (iVar7 + 1)]);
      }
      lVar11 = lVar11 + 1;
      printf("SMA%-14d%-20g%-20g \n",dVar12,(ulong)(iVar10 + 1));
    } while (lVar11 < obj->Q);
  }
  putchar(10);
  if (iVar4 < iVar3) {
    dVar12 = obj->mean;
    if (obj->vcov[(obj->q + obj->p + obj->P + obj->Q) * (iVar7 + 1)] < 0.0) {
      sqrt(obj->vcov[(obj->q + obj->p + obj->P + obj->Q) * (iVar7 + 1)]);
    }
    printf("%-17s%-20g%-20g \n",dVar12,"MEAN");
    if (0 < obj->r) {
      lVar11 = 0;
      do {
        dVar12 = obj->exog[lVar11];
        if (obj->vcov[(obj->p + obj->q + obj->P + obj->Q + (int)lVar11 + 1) * (iVar7 + 1)] < 0.0) {
          sqrt(obj->vcov[(obj->p + obj->q + obj->P + obj->Q + (int)lVar11 + 1) * (iVar7 + 1)]);
        }
        printf("%-17s%-20g%-20g \n",dVar12,"EXOG");
        lVar11 = lVar11 + 1;
      } while (lVar11 < obj->r);
    }
  }
  else {
    if (0 < obj->r) {
      lVar11 = 0;
      do {
        dVar12 = obj->exog[lVar11];
        if (obj->vcov[(obj->p + obj->q + obj->P + obj->Q + (int)lVar11) * (iVar7 + 1)] < 0.0) {
          sqrt(obj->vcov[(obj->p + obj->q + obj->P + obj->Q + (int)lVar11) * (iVar7 + 1)]);
        }
        printf("%-17s%-20g%-20g \n",dVar12,"EXOG");
        lVar11 = lVar11 + 1;
      } while (lVar11 < obj->r);
    }
    printf("%-17s%-20g \n",obj->mean,"MEAN");
  }
  putchar(10);
  printf("%-17s%-20g \n",obj->var,"SIGMA^2");
  putchar(10);
  printf("ESTIMATION METHOD : ");
  if ((ulong)(uint)obj->method < 3) {
    printf(*(char **)(&DAT_0015dd90 + (ulong)(uint)obj->method * 8));
  }
  puts("\n");
  printf("OPTIMIZATION METHOD : ");
  if ((ulong)(uint)obj->optmethod < 8) {
    printf((&PTR_anon_var_dwarf_b99_0015dda8)[(uint)obj->optmethod]);
  }
  puts("\n");
  printf("EQUATION FORM : x[t] ");
  if (0 < obj->p) {
    lVar11 = 0;
    do {
      dVar12 = obj->phi[lVar11];
      if (dVar12 <= 0.0) {
        if (dVar12 < 0.0) {
          dVar12 = ABS(dVar12);
          pcVar9 = "+ %g*x[t - %d%s";
          pcVar8 = "] ";
          goto LAB_0010fc53;
        }
      }
      else {
        pcVar9 = "- %g*x[t - %d%s";
        pcVar8 = "]";
LAB_0010fc53:
        printf(pcVar9,dVar12,(ulong)((int)lVar11 + 1),pcVar8);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < obj->p);
  }
  putchar(0x3d);
  if ((obj->mean != 0.0) || (NAN(obj->mean))) {
    printf(" %g +");
  }
  printf(" a[t] ");
  if (0 < obj->q) {
    lVar11 = 0;
    do {
      dVar12 = obj->theta[lVar11];
      if (dVar12 <= 0.0) {
        if (obj->phi[lVar11] <= 0.0 && obj->phi[lVar11] != 0.0) {
          dVar12 = ABS(dVar12);
          pcVar9 = "+ %g*a[t - %d%s";
          pcVar8 = "] ";
          goto LAB_0010fd03;
        }
      }
      else {
        pcVar9 = "- %g*a[t - %d%s";
        pcVar8 = "]";
LAB_0010fd03:
        printf(pcVar9,dVar12,(ulong)((int)lVar11 + 1),pcVar8);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < obj->q);
  }
  puts("\n");
  if ((uint)obj->method < 3) {
    printf("Log Likelihood : %g ",obj->loglik);
    puts("\n");
  }
  if ((uint)obj->method < 2) {
    printf("AIC criterion : %g ",obj->aic);
  }
  else {
    printf("AIC Criterion : Unavailable ");
  }
  puts("\n");
  return;
}

Assistant:

void sarimax_summary(sarimax_object obj) {
	int i, pq,t,nd,ncxreg,mean;
	pq = obj->p + obj->q + obj->P + obj->Q + obj->M;
	mean = obj->M - obj->r;
	
	if (obj->method == 0 || obj->method == 1) {
		printf("\n\nExit Status \n");
		printf("Return Code : %d \n", obj->retval);
		printf("Exit Message : ");

		if (obj->retval == 0) {
			printf("Input Error");
		}
		else if (obj->retval == 1) {
			printf("Probable Success");
		}
		else if (obj->retval == 4) {
			printf("Optimization Routine didn't converge");
		}
		else if (obj->retval == 7) {
			printf("Exogenous Variables are collinear");
		}
		else if (obj->retval == 10) {
			printf("Nonstationary AR part");
		}
		else if (obj->retval == 12) {
			printf("Nonstationary Seasonal AR part");
		}
		else if (obj->retval == 15) {
			printf("Optimization Routine Encountered Inf/Nan Values");
		}
	}
	printf("\n\n");
	printf("ARIMA Seasonal Order : ( %d, %d, %d) * (%d, %d, %d) \n",obj->p,obj->d,obj->q, obj->P,obj->D,obj->Q );
	printf("\n");
	//mdisplay(obj->vcov,pq,pq);
	printf("%-20s%-20s%-20s \n\n", "Coefficients", "Value", "Standard Error");
	for (i = 0; i < obj->p; ++i) {
		printf("AR%-15d%-20g%-20g \n", i + 1, obj->phi[i], sqrt(obj->vcov[i + pq*i]));
	}
	for (i = 0; i < obj->q; ++i) {
		t = obj->p + i;
		printf("MA%-15d%-20g%-20g \n", i + 1, obj->theta[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->P; ++i) {
		t = obj->p + obj->q + i;
		printf("SAR%-14d%-20g%-20g \n", i + 1, obj->PHI[i], sqrt(obj->vcov[t + pq * t]));
	}
	for (i = 0; i < obj->Q; ++i) {
		t = obj->p + obj->q + obj->P + i;
		printf("SMA%-14d%-20g%-20g \n", i + 1, obj->THETA[i], sqrt(obj->vcov[t + pq * t]));
	}
	printf("\n");
	t = obj->p + obj->q + obj->P + obj->Q;
	if (mean > 0) {
		printf("%-17s%-20g%-20g \n", "MEAN", obj->mean, sqrt(obj->vcov[t + pq * t]));
		for(i = 1; i <= obj->r; ++i) {
			t = obj->p + obj->q + obj->P + obj->Q + i;
			printf("%-17s%-20g%-20g \n", "EXOG", obj->exog[i-1], sqrt(obj->vcov[t + pq * t]));
		}
	}
	else {
		for(i = 0; i < obj->r; ++i) {
			t = obj->p + obj->q + obj->P + obj->Q + i;
			printf("%-17s%-20g%-20g \n", "EXOG", obj->exog[i], sqrt(obj->vcov[t + pq * t]));
		}
		printf("%-17s%-20g \n", "MEAN", obj->mean);
	}
	printf("\n");
	printf("%-17s%-20g \n", "SIGMA^2", obj->var);
	printf("\n");
	printf("ESTIMATION METHOD : ");
	if (obj->method == 0) {
		printf("CSS-MLE");
	}
	else if (obj->method == 1) {
		printf("MLE");
	}
	else if (obj->method == 2) {
		printf("CSS");
	}
	printf("\n\n");
	printf("OPTIMIZATION METHOD : ");
	
	if (obj->optmethod == 0) {
		printf("Nelder-Mead");
	}
	else if (obj->optmethod == 1) {
		printf("Newton Line Search");
	}
	else if (obj->optmethod == 2) {
		printf("Newton Trust Region - Hook Step");
	}
	else if (obj->optmethod == 3) {
		printf("Newton Trust Region - Double Dog-Leg");
	}
	else if (obj->optmethod == 4) {
		printf("Conjugate Gradient");
	}
	else if (obj->optmethod == 5) {
		printf("BFGS");
	}
	else if (obj->optmethod == 6) {
		printf("L-BFGS");
	}
	else if (obj->optmethod == 7) {
		printf("BFGS More-Thuente Line Search");
	}
	
	printf("\n\n");
	printf("EQUATION FORM : x[t] ");
	for (i = 0; i < obj->p; ++i) {
		if (obj->phi[i] > 0) {
			printf("- %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*x[t - %d%s", fabs(obj->phi[i]), i + 1, "] ");
		}
	}

	printf("=");
	if (obj->mean != 0.0) {
		printf(" %g +", obj->mean);
	}
	printf(" a[t] ");
	for (i = 0; i < obj->q; ++i) {
		if (obj->theta[i] > 0) {
			printf("- %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "]");
		}
		else if (obj->phi[i] < 0) {
			printf("+ %g*a[t - %d%s", fabs(obj->theta[i]), i + 1, "] ");
		}
	}
	printf("\n\n");
	if (obj->method == 0 || obj->method == 1 || obj->method == 2) {
		printf("Log Likelihood : %g ", obj->loglik);
		printf("\n\n");
	}
	if (obj->method == 0 || obj->method == 1) {
		printf("AIC criterion : %g ", obj->aic);
		printf("\n\n");
	}
	else {
		printf("AIC Criterion : Unavailable ");
		printf("\n\n");
	}
}